

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_0::RelativeChangeCase::calibrate(RelativeChangeCase *this)

{
  TestLog *log;
  code *pcVar1;
  deUint32 dVar2;
  int iVar3;
  State SVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  deUint64 dVar7;
  deUint64 dVar8;
  deUint8 buffer [4];
  int iStack_238;
  TheilSenCalibrator calibrator;
  RenderData geom;
  long lVar6;
  
  iVar3 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  log = ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            ((ObjectData *)&calibrator,this);
  RenderData::RenderData(&geom,(ObjectData *)&calibrator,(this->super_BaseCase).m_renderCtx,log);
  ObjectData::~ObjectData((ObjectData *)&calibrator);
  buffer[0] = '\x14';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  iStack_238 = 10;
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator(&calibrator,(CalibratorParameters *)buffer);
  while( true ) {
    while( true ) {
      SVar4 = deqp::gls::TheilSenCalibrator::getState(&calibrator);
      dVar2 = geom.m_program.m_program.m_program;
      if (SVar4 != STATE_RECOMPUTE_PARAMS) break;
      deqp::gls::TheilSenCalibrator::recomputeParameters(&calibrator);
    }
    if (SVar4 != STATE_MEASURE) break;
    (**(code **)(lVar6 + 0x1680))(geom.m_program.m_program.m_program);
    pcVar1 = *(code **)(lVar6 + 0x14f0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(dVar2,"u_iterations");
    (*pcVar1)(uVar5,calibrator.m_measureState.numDrawCalls);
    dVar7 = deGetMicroseconds();
    (**(code **)(lVar6 + 0x188))(0x4500);
    (**(code **)(lVar6 + 0x4e8))(0xb71);
    BaseCase::render(&this->super_BaseCase,&geom);
    (**(code **)(lVar6 + 0x1220))(0,0,1,1,0x1908,0x1401,buffer);
    dVar8 = deGetMicroseconds();
    deqp::gls::TheilSenCalibrator::recordIteration(&calibrator,dVar8 - dVar7);
  }
  iVar3 = 1;
  if (SVar4 == STATE_FINISHED) {
    deqp::gls::logCalibrationInfo
              (((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&calibrator);
    iVar3 = calibrator.m_measureState.numDrawCalls;
  }
  deqp::gls::TheilSenCalibrator::~TheilSenCalibrator(&calibrator);
  RenderData::~RenderData(&geom);
  return iVar3;
}

Assistant:

int RelativeChangeCase::calibrate (void) const
{
	using namespace gls;

	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	const RenderData		geom	(genOccludedGeometry(), m_renderCtx, log);

	TheilSenCalibrator calibrator(CalibratorParameters( 20, // Initial workload
														10, // Max iteration frames
														20.0f, // Iteration shortcut threshold ms
														20, // Max iterations
														33.0f, // Target frame time
														40.0f, // Frame time cap
														1000.0f // Target measurement duration
														));

	while (true)
	{
		switch(calibrator.getState())
		{
			case TheilSenCalibrator::STATE_FINISHED:
				logCalibrationInfo(m_testCtx.getLog(), calibrator);
				return calibrator.getCallCount();

			case TheilSenCalibrator::STATE_MEASURE:
			{
				deUint8			buffer[4];
				const GLuint	program	= geom.m_program.getProgram();

				gl.useProgram(program);
				gl.uniform1i(gl.getUniformLocation(program, "u_iterations"), calibrator.getCallCount());

				const deInt64 prev = deGetMicroseconds();

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				gl.disable(GL_DEPTH_TEST);

				render(geom);

				gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				const deInt64 now = deGetMicroseconds();

				calibrator.recordIteration(now - prev);
				break;
			}

			case TheilSenCalibrator::STATE_RECOMPUTE_PARAMS:
				calibrator.recomputeParameters();
				break;
			default:
				DE_ASSERT(false);
				return 1;
		}
	}
}